

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input_.cxx
# Opt level: O0

int __thiscall Fl_Input_::position(Fl_Input_ *this,int p,int m)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  Fl_Input_ *pFVar4;
  bool bVar5;
  bool bVar6;
  int local_28;
  int ul;
  int is_same;
  int m_local;
  int p_local;
  Fl_Input_ *this_local;
  
  was_up_down = 0;
  is_same = p;
  if (p < 0) {
    is_same = 0;
  }
  iVar2 = size(this);
  if (iVar2 < is_same) {
    is_same = size(this);
  }
  ul = m;
  if (m < 0) {
    ul = 0;
  }
  iVar2 = size(this);
  if (iVar2 < ul) {
    ul = size(this);
  }
  bVar5 = is_same == ul;
  while( true ) {
    bVar6 = false;
    if ((is_same < this->position_) && (bVar6 = false, 0 < is_same)) {
      iVar2 = size(this);
      bVar6 = false;
      if (0 < iVar2 - is_same) {
        pcVar3 = value(this);
        iVar2 = fl_utf8len(pcVar3[is_same]);
        bVar6 = iVar2 < 1;
      }
    }
    if (!bVar6) break;
    is_same = is_same + -1;
  }
  pcVar3 = value(this);
  local_28 = fl_utf8len(pcVar3[is_same]);
  while( true ) {
    iVar2 = size(this);
    bVar6 = false;
    if ((is_same < iVar2) && (bVar6 = false, this->position_ < is_same)) {
      bVar6 = local_28 < 0;
    }
    if (!bVar6) break;
    is_same = is_same + 1;
    pcVar3 = value(this);
    local_28 = fl_utf8len(pcVar3[is_same]);
  }
  while( true ) {
    bVar6 = false;
    if ((ul < this->mark_) && (bVar6 = false, 0 < ul)) {
      iVar2 = size(this);
      bVar6 = false;
      if (0 < iVar2 - ul) {
        pcVar3 = value(this);
        iVar2 = fl_utf8len(pcVar3[ul]);
        bVar6 = iVar2 < 1;
      }
    }
    if (!bVar6) break;
    ul = ul + -1;
  }
  pcVar3 = value(this);
  local_28 = fl_utf8len(pcVar3[ul]);
  while( true ) {
    iVar2 = size(this);
    bVar6 = false;
    if ((ul < iVar2) && (bVar6 = false, this->mark_ < ul)) {
      bVar6 = local_28 < 0;
    }
    if (!bVar6) break;
    ul = ul + 1;
    pcVar3 = value(this);
    local_28 = fl_utf8len(pcVar3[ul]);
  }
  if (bVar5) {
    ul = is_same;
  }
  if ((is_same == this->position_) && (ul == this->mark_)) {
    this_local._4_4_ = 0;
  }
  else {
    if (is_same == ul) {
      if (this->position_ == this->mark_) {
        pFVar4 = (Fl_Input_ *)Fl::focus();
        if ((pFVar4 == this) &&
           (bVar1 = Fl_Widget::damage(&this->super_Fl_Widget), (bVar1 & 2) == 0)) {
          minimal_update(this,this->position_);
          this->erase_cursor_only = '\x01';
        }
      }
      else {
        minimal_update(this,this->position_,this->mark_);
      }
    }
    else {
      if (is_same != this->position_) {
        minimal_update(this,this->position_,is_same);
      }
      if (ul != this->mark_) {
        minimal_update(this,this->mark_,ul);
      }
    }
    this->position_ = is_same;
    this->mark_ = ul;
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Input_::position(int p, int m) {
  int is_same = 0;
  was_up_down = 0;
  if (p<0) p = 0;
  if (p>size()) p = size();
  if (m<0) m = 0;
  if (m>size()) m = size();
  if (p == m) is_same = 1;

  while (p < position_ && p > 0 && (size() - p) > 0 &&
       (fl_utf8len((char)(value() + p)[0]) < 1)) { p--; }
  int ul = fl_utf8len((char)(value() + p)[0]);
  while (p < size() && p > position_ && ul < 0) {
       p++;
       ul = fl_utf8len((char)(value() + p)[0]);
  }

  while (m < mark_ && m > 0 && (size() - m) > 0 &&
       (fl_utf8len((char)(value() + m)[0]) < 1)) { m--; }
  ul = fl_utf8len((char)(value() + m)[0]);
  while (m < size() && m > mark_ && ul < 0) {
       m++;
       ul = fl_utf8len((char)(value() + m)[0]);
  }
  if (is_same) m = p;
  if (p == position_ && m == mark_) return 0;


  //if (Fl::selection_owner() == this) Fl::selection_owner(0);
  if (p != m) {
    if (p != position_) minimal_update(position_, p);
    if (m != mark_) minimal_update(mark_, m);
  } else {
    // new position is a cursor
    if (position_ == mark_) {
      // old position was just a cursor
      if (Fl::focus() == this && !(damage()&FL_DAMAGE_EXPOSE)) {
	minimal_update(position_); erase_cursor_only = 1;
      }
    } else { // old position was a selection
      minimal_update(position_, mark_);
    }
  }
  position_ = p;
  mark_ = m;
  return 1;
}